

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_intersect.cpp
# Opt level: O3

int ON_Intersect(ON_Line *line,ON_Cylinder *cylinder,ON_3dPoint *A,ON_3dPoint *B)

{
  ON_3dVector *v;
  ON_3dPoint *point;
  ON_3dPoint point_00;
  ON_3dPoint point_01;
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  double dVar6;
  ON_3dVector V;
  double axis_t;
  ON_Line L;
  double t1;
  double line_t;
  ON_3dPoint axis_point;
  ON_Line axis;
  double t0;
  ON_Xform xform;
  ON_3dPoint line_point;
  ON_3dPoint local_228;
  double local_208;
  double local_200;
  double local_1f8;
  ulong uStack_1f0;
  double local_1e0;
  ON_Line local_1d8;
  double local_1a0;
  double local_198;
  double local_190;
  ON_3dPoint local_188;
  ON_Line local_168;
  ON_3dVector local_138;
  double local_120;
  ON_Xform local_118;
  ON_3dVector local_90;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  local_1f8 = (cylinder->circle).radius;
  uStack_1f0 = 0;
  ON_Line::ON_Line(&local_168);
  v = &(cylinder->circle).plane.zaxis;
  operator*((ON_3dVector *)&local_1d8,cylinder->height[0],v);
  ON_3dPoint::operator+((ON_3dPoint *)&local_118,(ON_3dPoint *)cylinder,(ON_3dVector *)&local_1d8);
  local_168.from.z = local_118.m_xform[0][2];
  local_168.from.x = local_118.m_xform[0][0];
  local_168.from.y = local_118.m_xform[0][1];
  operator*((ON_3dVector *)&local_1d8,cylinder->height[1],v);
  ON_3dPoint::operator+((ON_3dPoint *)&local_118,(ON_3dPoint *)cylinder,(ON_3dVector *)&local_1d8);
  local_168.to.z = local_118.m_xform[0][2];
  local_168.to.x = local_118.m_xform[0][0];
  local_168.to.y = local_118.m_xform[0][1];
  local_1e0 = ON_Line::Length(&local_168);
  local_1f8 = ABS(local_1f8);
  uStack_1f0 = uStack_1f0 & 0x7fffffffffffffff;
  local_208 = 2.3283064365386963e-10;
  if (2.3283064365386963e-10 <= local_1f8 * 1.490116119385e-08) {
    local_208 = local_1f8 * 1.490116119385e-08;
  }
  if (local_1e0 <= local_208) {
    ON_3dPoint::operator+((ON_3dPoint *)&local_118,(ON_3dPoint *)cylinder,v);
    local_168.to.z = local_118.m_xform[0][2];
    local_168.to.x = local_118.m_xform[0][0];
    local_168.to.y = local_118.m_xform[0][1];
  }
  bVar1 = ON_Intersect(line,&local_168,&local_190,&local_200);
  if (!bVar1) {
    ON_Line::ClosestPointTo(&local_168,(ON_3dPoint *)cylinder,&local_200);
    ON_Line::ClosestPointTo(line,(ON_3dPoint *)cylinder,&local_190);
  }
  ON_Line::PointAt(&local_78,line,local_190);
  ON_Line::PointAt(&local_188,&local_168,local_200);
  local_1a0 = ON_3dPoint::DistanceTo(&local_78,&local_188);
  if (local_208 < local_1e0) {
    uVar3 = SUB84(local_200,0);
    uVar4 = (undefined4)((ulong)local_200 >> 0x20);
    if (0.0 <= local_200) {
      if (1.0 < local_200) {
        local_200 = 1.0;
        uVar3 = 0;
        uVar4 = 0x3ff00000;
      }
    }
    else {
      local_200 = 0.0;
      uVar3 = 0;
      uVar4 = 0;
    }
    ON_Line::PointAt((ON_3dPoint *)&local_118,&local_168,(double)CONCAT44(uVar4,uVar3));
    local_188.z = local_118.m_xform[0][2];
    local_188.x = local_118.m_xform[0][0];
    local_188.y = local_118.m_xform[0][1];
  }
  if (local_1f8 - local_208 <= local_1a0) {
    A->z = local_78.z;
    A->x = local_78.x;
    A->y = local_78.y;
    ON_3dPoint::operator-((ON_3dVector *)&local_118,&local_78,&local_188);
    if (local_208 < local_1e0) {
      dVar5 = ON_3dVector::operator*((ON_3dVector *)&local_118,v);
      operator*((ON_3dVector *)&local_228,dVar5,v);
      ON_3dVector::operator-
                ((ON_3dVector *)&local_1d8,(ON_3dVector *)&local_118,(ON_3dVector *)&local_228);
      local_118.m_xform[0][2] = local_1d8.from.z;
      local_118.m_xform[0][0] = local_1d8.from.x;
      local_118.m_xform[0][1] = local_1d8.from.y;
    }
    ON_3dVector::Unitize((ON_3dVector *)&local_118);
    operator*((ON_3dVector *)&local_228,local_1f8,(ON_3dVector *)&local_118);
    ON_3dPoint::operator+(&local_1d8.from,&local_188,(ON_3dVector *)&local_228);
    iVar2 = 0;
    B->z = local_1d8.from.z;
    B->x = local_1d8.from.x;
    B->y = local_1d8.from.y;
    if (local_1a0 <= local_1f8 + local_208) {
      ON_Line::ClosestPointTo(&local_1d8.from,&local_168,&line->from);
      dVar5 = ON_3dPoint::DistanceTo(&local_1d8.from,&line->from);
      iVar2 = 1;
      if (ABS(dVar5 - local_1f8) <= local_208) {
        point = &line->to;
        ON_Line::ClosestPointTo(&local_228,&local_168,point);
        local_1d8.from.z = local_228.z;
        local_1d8.from.x = local_228.x;
        local_1d8.from.y = local_228.y;
        dVar5 = ON_3dPoint::DistanceTo(&local_1d8.from,point);
        if (ABS(dVar5 - local_1f8) <= local_208) {
          ON_Cylinder::ClosestPointTo(&local_228,cylinder,line->from);
          A->z = local_228.z;
          A->x = local_228.x;
          A->y = local_228.y;
          ON_Cylinder::ClosestPointTo(&local_228,cylinder,*point);
          B->z = local_228.z;
          B->x = local_228.x;
          B->y = local_228.y;
          iVar2 = 3;
        }
      }
    }
  }
  else {
    ON_Xform::ON_Xform(&local_118);
    ON_Xform::Rotation(&local_118,(ON_Plane *)cylinder,&ON_xy_plane);
    local_1d8.from.x = (line->from).x;
    local_1d8.from.y = (line->from).y;
    local_1d8.from.z = (line->from).z;
    local_1d8.to.x = (line->to).x;
    local_1d8.to.y = (line->to).y;
    local_1d8.to.z = (line->to).z;
    ON_Line::Transform(&local_1d8,&local_118);
    dVar6 = local_1d8.to.x - local_1d8.from.x;
    dVar5 = local_1d8.to.y - local_1d8.from.y;
    iVar2 = ON_SolveQuadraticEquation
                      (dVar5 * dVar5 + dVar6 * dVar6,
                       (dVar5 + dVar5) * local_1d8.from.y + (dVar6 + dVar6) * local_1d8.from.x,
                       (local_1d8.from.y * local_1d8.from.y + local_1d8.from.x * local_1d8.from.x) -
                       local_1f8 * local_1f8,&local_120,&local_198);
    if (iVar2 == 2) {
      local_198 = local_120;
    }
    ON_Line::PointAt(&local_48,line,local_120);
    point_00.y = local_48.y;
    point_00.x = local_48.x;
    point_00.z = local_48.z;
    ON_Cylinder::ClosestPointTo(&local_228,cylinder,point_00);
    A->z = local_228.z;
    A->x = local_228.x;
    A->y = local_228.y;
    ON_Line::PointAt(&local_60,line,local_198);
    point_01.y = local_60.y;
    point_01.x = local_60.x;
    point_01.z = local_60.z;
    ON_Cylinder::ClosestPointTo(&local_228,cylinder,point_01);
    B->z = local_228.z;
    B->x = local_228.x;
    B->y = local_228.y;
    dVar5 = ON_3dPoint::DistanceTo(A,B);
    iVar2 = 2;
    if (dVar5 <= 2.3283064365386963e-10) {
      A->z = local_78.z;
      A->x = local_78.x;
      A->y = local_78.y;
      ON_3dPoint::operator-((ON_3dVector *)&local_228,&local_78,&local_188);
      if (local_208 < local_1e0) {
        dVar5 = ON_3dVector::operator*((ON_3dVector *)&local_228,v);
        operator*(&local_90,dVar5,v);
        ON_3dVector::operator-(&local_138,(ON_3dVector *)&local_228,&local_90);
        local_228.z = local_138.z;
        local_228.x = local_138.x;
        local_228.y = local_138.y;
      }
      ON_3dVector::Unitize((ON_3dVector *)&local_228);
      operator*(&local_90,local_1f8,(ON_3dVector *)&local_228);
      ON_3dPoint::operator+((ON_3dPoint *)&local_138,&local_188,&local_90);
      B->z = local_138.z;
      B->x = local_138.x;
      B->y = local_138.y;
      iVar2 = 1;
    }
    ON_Line::~ON_Line(&local_1d8);
  }
  ON_Line::~ON_Line(&local_168);
  return iVar2;
}

Assistant:

int ON_Intersect(
        const ON_Line& line, 
        const ON_Cylinder& cylinder, // if cylinder.height[0]==cylinder.height[1],
                                     // then infinite cyl is used.  Otherwise
                                     // finite cyl is used.
        ON_3dPoint& A, ON_3dPoint& B // intersection point(s) returned here
        )
{
  bool bFiniteCyl = true;
  int rc = 0;
  const double cylinder_radius = fabs(cylinder.circle.radius);
  double tol = cylinder_radius*ON_SQRT_EPSILON;
  if ( tol < ON_ZERO_TOLERANCE )
    tol = ON_ZERO_TOLERANCE;

  ON_Line axis;
  axis.from = cylinder.circle.plane.origin + cylinder.height[0]*cylinder.circle.plane.zaxis;
  axis.to   = cylinder.circle.plane.origin + cylinder.height[1]*cylinder.circle.plane.zaxis;
  if ( axis.Length() <= tol ) {
    axis.to = cylinder.circle.plane.origin + cylinder.circle.plane.zaxis;
    bFiniteCyl = false;
  }


  //bool bIsParallel = false;
  double line_t, axis_t;
  if ( !ON_Intersect(line,axis,&line_t,&axis_t) ) {
    axis.ClosestPointTo( cylinder.circle.plane.origin, &axis_t );
    line.ClosestPointTo( cylinder.circle.plane.origin, &line_t );
  }
  ON_3dPoint line_point = line.PointAt(line_t);
  ON_3dPoint axis_point = axis.PointAt(axis_t);
  double d = line_point.DistanceTo(axis_point);
  if ( bFiniteCyl ) {
    if ( axis_t < 0.0 )
      axis_t = 0.0;
    else if ( axis_t > 1.0 )
      axis_t = 1.0;
    axis_point = axis.PointAt(axis_t);
  }
  
  if ( d >= cylinder_radius-tol) {
    rc = ( d <= cylinder_radius+tol ) ? 1 : 0;
    A = line_point;
    ON_3dVector V = line_point - axis_point;
    if ( bFiniteCyl ) {
      V = V - (V*cylinder.circle.plane.zaxis)*cylinder.circle.plane.zaxis;
    }
    V.Unitize();
    B = axis_point + cylinder_radius*V;
    if ( rc == 1 ) {
      // check for overlap
      ON_3dPoint P = axis.ClosestPointTo(line.from);
      d = P.DistanceTo(line.from);
      if ( fabs(d-cylinder_radius) <= tol ) {
        P = axis.ClosestPointTo(line.to);
        d = P.DistanceTo(line.to);
        if ( fabs(d-cylinder_radius) <= tol ) {
          rc = 3;
          A = cylinder.ClosestPointTo(line.from);
          B = cylinder.ClosestPointTo(line.to);
        }
      }
    }
  }
  else {
    // transform to coordinate system where equation of cyl
    // is x^2 + y^2 = R^2 and solve for line parameter(s).
    ON_Xform xform;
    xform.Rotation( cylinder.circle.plane, ON_xy_plane );
    ON_Line L = line;
    L.Transform(xform);

    const double x0 = L.from.x;
    const double x1 = L.to.x;
    const double x1mx0 = x1-x0;
    double ax = x1mx0*x1mx0;
    double bx = 2.0*x1mx0*x0;
    double cx = x0*x0;

    const double y0 = L.from.y;
    const double y1 = L.to.y;
    const double y1my0 = y1-y0;
    double ay = y1my0*y1my0;
    double by = 2.0*y1my0*y0;
    double cy = y0*y0;

    double t0, t1;
    int qerc = ON_SolveQuadraticEquation(ax+ay, bx+by, cx+cy-cylinder_radius*cylinder_radius,
                                         &t0,&t1);
    if ( qerc == 2 ) {
      // complex roots - ignore (tiny) imaginary part caused by computational noise.
      t1 = t0;
    }
    A = cylinder.ClosestPointTo(line.PointAt(t0));
    B = cylinder.ClosestPointTo(line.PointAt(t1));

    d = A.DistanceTo(B);
    if ( d <= ON_ZERO_TOLERANCE ) {
      A = line_point;
      ON_3dVector V = line_point - axis_point;
      if ( bFiniteCyl ) {
        V = V - (V*cylinder.circle.plane.zaxis)*cylinder.circle.plane.zaxis;
      }
      V.Unitize();
      B = axis_point + cylinder_radius*V;
      rc = 1;
    }    
    else
      rc = 2;
  }
  return rc;
}